

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O3

uint64_t __thiscall google::protobuf::internal::ThreadSafeArena::Reset(ThreadSafeArena *this)

{
  ulong uVar1;
  long lVar2;
  uint64_t uVar3;
  ArenaBlock *this_00;
  char *pcVar4;
  char *pcVar5;
  uint64_t uVar6;
  long *in_FS_OFFSET;
  SizedPtr SVar7;
  
  uVar3 = SpaceAllocated(this);
  CleanupList(this);
  (this->first_arena_).cleanup_list_.limit_ = (CleanupNode *)0x0;
  (this->first_arena_).cleanup_list_.prefetch_ptr_ = (char *)0x0;
  (this->first_arena_).cleanup_list_.head_ = (Chunk *)0x0;
  (this->first_arena_).cleanup_list_.next_ = (CleanupNode *)0x0;
  SVar7 = Free(this);
  this_00 = (ArenaBlock *)SVar7.p;
  uVar1 = (this->alloc_policy_).policy_;
  if ((uVar1 & 0xfffffffffffffff9) == 0) {
    pcVar4 = ArenaBlock::Pointer((ArenaBlock *)(anonymous_namespace)::kSentryArenaBlock,0);
    pcVar5 = ArenaBlock::Pointer((ArenaBlock *)(anonymous_namespace)::kSentryArenaBlock,0);
    (this->first_arena_).ptr_._M_b._M_p = pcVar4;
    (this->first_arena_).prefetch_ptr_ = pcVar4;
    (this->first_arena_).limit_ = pcVar5;
    (this->first_arena_).head_._M_b._M_p = (__pointer_type)(anonymous_namespace)::kSentryArenaBlock;
    (this->first_arena_).space_used_.super___atomic_base<unsigned_long>._M_i = 0;
    (this->first_arena_).space_allocated_.super___atomic_base<unsigned_long>._M_i = 0;
  }
  else {
    ArenaBlock::ArenaBlock(this_00,(ArenaBlock *)0x0,SVar7.n);
    pcVar4 = ArenaBlock::Pointer(this_00,(ulong)(7 < uVar1) << 5 | 0x10);
    pcVar5 = ArenaBlock::Pointer(this_00,this_00->size & 0xfffffffffffffff8);
    (this->first_arena_).ptr_._M_b._M_p = pcVar4;
    (this->first_arena_).prefetch_ptr_ = pcVar4;
    (this->first_arena_).limit_ = pcVar5;
    (this->first_arena_).head_._M_b._M_p = this_00;
    (this->first_arena_).space_used_.super___atomic_base<unsigned_long>._M_i = 0;
    (this->first_arena_).space_allocated_.super___atomic_base<unsigned_long>._M_i = this_00->size;
  }
  (this->first_arena_).cached_block_length_ = '\0';
  (this->first_arena_).cached_blocks_ = (CachedBlock **)0x0;
  (this->first_arena_).string_block_._M_b._M_p = (__pointer_type)0x0;
  (this->first_arena_).string_block_unused_.super___atomic_base<unsigned_long>._M_i = 0;
  lVar2 = *in_FS_OFFSET;
  uVar6 = in_FS_OFFSET[-0x10];
  if ((char)uVar6 == '\0') {
    LOCK();
    UNLOCK();
    uVar6 = lifecycle_id_ << 8;
    lifecycle_id_ = lifecycle_id_ + 1;
  }
  in_FS_OFFSET[-0x10] = uVar6 + 1;
  this->tag_and_id_ = uVar6;
  (this->head_)._M_b._M_p = (__pointer_type)kSentryArenaChunk;
  this->first_owner_ = (void *)(lVar2 + -0x80);
  in_FS_OFFSET[-0xe] = (long)&this->first_arena_;
  in_FS_OFFSET[-0xf] = uVar6;
  return uVar3;
}

Assistant:

uint64_t ThreadSafeArena::Reset() {
  const size_t space_allocated = SpaceAllocated();

  // Have to do this in a first pass, because some of the destructors might
  // refer to memory in other blocks.
  CleanupList();
  // Reset the first arena's cleanup list.
  first_arena_.cleanup_list_ = cleanup::ChunkList();

  // Discard all blocks except the first one. Whether it is user-provided or
  // allocated, always reuse the first block for the first arena.
  auto mem = Free();

  // Reset the first arena with the first block. This avoids redundant
  // free / allocation and re-allocating for AllocationPolicy. Adjust offset if
  // we need to preserve alloc_policy_.
  if (alloc_policy_.is_user_owned_initial_block() ||
      alloc_policy_.get() != nullptr) {
    size_t offset = alloc_policy_.get() == nullptr
                        ? kBlockHeaderSize
                        : kBlockHeaderSize + kAllocPolicySize;
    ABSL_ANNOTATE_MEMORY_IS_UNINITIALIZED(static_cast<char*>(mem.p) + offset,
                                          mem.n - offset);
    first_arena_.Init(new (mem.p) ArenaBlock{nullptr, mem.n}, offset);
  } else {
    first_arena_.Init(SentryArenaBlock(), 0);
  }

  // Since the first block and potential alloc_policy on the first block is
  // preserved, this can be initialized by Init().
  Init();

  return space_allocated;
}